

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

EVsource old_EVcreate_submit_handle(CManager cm,EVstone stone,CMFormatList format_list)

{
  FMFieldList list;
  char **ppcVar1;
  int iVar2;
  CMFormatList pCVar3;
  FMStructDescList data_format;
  EVsource p_Var4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  
  uVar7 = (ulong)(uint)stone;
  if (format_list == (CMFormatList)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    pCVar3 = format_list;
    do {
      uVar6 = uVar6 + 1;
      ppcVar1 = &pCVar3->format_name;
      pCVar3 = pCVar3 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  uVar8 = (ulong)uVar6;
  data_format = (FMStructDescList)INT_CMmalloc(uVar8 * 0x20 + 0x20);
  if (uVar6 == 0) {
    uVar8 = 0;
  }
  else {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)&data_format->format_name + lVar5 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar5);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar5);
      *(FMFieldList *)((long)&data_format->field_list + lVar5 * 2) = list;
      iVar2 = struct_size_field_list(list,(int)uVar7);
      *(int *)((long)&data_format->struct_size + lVar5 * 2) = iVar2;
      *(undefined8 *)((long)&data_format->opt_info + lVar5 * 2) = 0;
      lVar5 = lVar5 + 0x10;
    } while (uVar8 << 4 != lVar5);
  }
  data_format[uVar8].format_name = (char *)0x0;
  data_format[uVar8].field_list = (FMFieldList)0x0;
  p_Var4 = EVcreate_submit_handle(cm,stone,data_format);
  return p_Var4;
}

Assistant:

extern EVsource
old_EVcreate_submit_handle(CManager cm, EVstone stone, CMFormatList format_list)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return EVcreate_submit_handle(cm, stone, structs);
}